

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

void __thiscall
glcts::UniformBlocksLayoutBindingCase::setupTest(UniformBlocksLayoutBindingCase *this)

{
  Functions *pFVar1;
  undefined8 local_18;
  float f [2];
  UniformBlocksLayoutBindingCase *this_local;
  
  local_18 = 0x3f4000003e800000;
  f = (float  [2])this;
  pFVar1 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
  (*pFVar1->genBuffers)(1,(GLuint *)&(this->super_LayoutBindingBaseCase).field_0x224);
  pFVar1 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
  (*pFVar1->bindBuffer)(0x8a11,*(GLuint *)&(this->super_LayoutBindingBaseCase).field_0x224);
  pFVar1 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
  (*pFVar1->bufferData)(0x8a11,8,&local_18,0x88e4);
  return;
}

Assistant:

void setupTest(void)
	{
		const float f[2] = { 0.25f, 0.75f };
		gl().genBuffers(1, &m_buffername);
		gl().bindBuffer(GL_UNIFORM_BUFFER, m_buffername);
		gl().bufferData(GL_UNIFORM_BUFFER, sizeof(f), f, GL_STATIC_DRAW);
	}